

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioFileWriter.cpp
# Opt level: O2

ssize_t __thiscall AudioFileWriter::write(AudioFileWriter *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  ulong uVar2;
  QDebug *this_00;
  long lVar3;
  uint uVar4;
  undefined4 in_register_00000034;
  int *sourceBuffer;
  int *piVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  qint16 cnvBuffer [8192];
  QDebug local_4080;
  AudioFileWriter *local_4078;
  QArrayDataPointer<char16_t> local_4070;
  undefined4 local_4058;
  undefined8 local_4054;
  undefined8 uStack_404c;
  undefined4 local_4044;
  char *local_4040;
  int local_4038 [4098];
  
  sourceBuffer = (int *)CONCAT44(in_register_00000034,__fd);
  uVar6 = (ulong)__buf & 0xffffffff;
  uVar2 = QIODevice::isOpen();
  if ((char)uVar2 == '\0') {
    uVar2 = 0;
  }
  else {
    uVar8 = uVar6;
    local_4078 = this;
    if (this->skipSilence == true) {
      uVar8 = 0;
      for (lVar3 = 0; piVar5 = (int *)((long)sourceBuffer + lVar3), uVar2 = uVar6,
          piVar5 < sourceBuffer + uVar6; lVar3 = lVar3 + 4) {
        if (*piVar5 != 0) {
          this->skipSilence = false;
          uVar2 = uVar6 * 4 - lVar3 >> 2;
          sourceBuffer = piVar5;
          uVar8 = uVar2 & 0xffffffff;
          break;
        }
      }
    }
    while( true ) {
      uVar7 = (uint)uVar8;
      uVar2 = CONCAT71((int7)(uVar2 >> 8),uVar7 == 0);
      if (uVar7 == 0) break;
      uVar4 = 0x1000;
      if (uVar7 < 0x1000) {
        uVar4 = uVar7;
      }
      piVar5 = local_4038;
      bVar1 = convertSamplesFromNativeEndian
                        ((qint16 *)sourceBuffer,(qint16 *)piVar5,uVar4 * 2,
                         (uint)local_4078->waveMode);
      if (!bVar1) {
        uVar4 = uVar7;
        piVar5 = sourceBuffer;
      }
      for (uVar6 = (ulong)(uVar4 * 4); 0 < (long)uVar6; uVar6 = uVar6 - lVar3) {
        lVar3 = QIODevice::write((char *)&this->file,(longlong)piVar5);
        if (lVar3 == -1) {
          local_4058 = 2;
          local_4044 = 0;
          local_4054 = 0;
          uStack_404c = 0;
          local_4040 = "default";
          QMessageLogger::debug();
          this_00 = QDebug::operator<<(&local_4080,
                                       "AudioFileWriter: error writing into the audio file:");
          QIODevice::errorString();
          QDebug::operator<<(this_00,(QString *)&local_4070);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_4070);
          QDebug::~QDebug(&local_4080);
          QFileDevice::close();
          return uVar2 & 0xffffffff;
        }
        piVar5 = (int *)((long)piVar5 + lVar3);
      }
      uVar2 = (ulong)(uVar4 * 2);
      sourceBuffer = (int *)((long)sourceBuffer + (ulong)(uVar4 * 2) * 2);
      uVar8 = (ulong)(uVar7 - uVar4);
    }
  }
  return uVar2;
}

Assistant:

bool AudioFileWriter::write(const qint16 *buffer, uint totalFrames) {
	static const uint MAX_FRAMES_PER_RUN = 4096;

	if (!file.isOpen()) return false;

	const qint32 *startPos = (const qint32 *)buffer;
	if (skipSilence) {
		const qint32 *endPos = startPos + totalFrames;
		totalFrames = 0;
		for (const qint32 *p = startPos; p < endPos; p++) {
			if (*p != 0) {
				skipSilence = false;
				totalFrames = endPos - p;
				buffer = (const qint16 *)p;
				break;
			}
		}
	}

	qint16 cnvBuffer[MAX_FRAMES_PER_RUN << 1];
	while (totalFrames > 0) {
		uint framesToWrite = qMin(MAX_FRAMES_PER_RUN, totalFrames);
		bool converted = convertSamplesFromNativeEndian(buffer, cnvBuffer, framesToWrite << 1, waveMode ? QSysInfo::LittleEndian : QSysInfo::BigEndian);
		if (!converted) framesToWrite = totalFrames;

		const char *bufferPos = (const char *)(converted ? cnvBuffer : buffer);
		qint64 bytesToWrite = framesToWrite * FRAME_SIZE;
		while (bytesToWrite > 0) {
			qint64 bytesWritten = file.write(bufferPos, bytesToWrite);
			if (bytesWritten == -1) {
				qDebug() << "AudioFileWriter: error writing into the audio file:" << file.errorString();
				file.close();
				return false;
			}
			bytesToWrite -= bytesWritten;
			bufferPos += bytesWritten;
		}
		buffer += framesToWrite << 1;
		totalFrames -= framesToWrite;
	}
	return true;
}